

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O1

void borg_flow_spread(wchar_t depth,_Bool optimize,_Bool avoid,_Bool tunneling,wchar_t stair_idx,
                     _Bool sneak)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  chunk_conflict *pcVar7;
  _Bool _Var8;
  wchar_t wVar9;
  loc lVar10;
  int iVar11;
  wchar_t wVar12;
  int iVar13;
  borg_grid *pbVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  wchar_t wVar19;
  wchar_t feat;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  uint local_88;
  char local_7c;
  
  iVar11 = borg.c.y;
  iVar17 = borg.c.x;
  local_7c = optimize;
  if ((L'\xffffffff' < stair_idx) && (borg.trait[0x23] < 0xf)) {
    iVar11 = track_less.y[(uint)stair_idx];
    iVar17 = track_less.x[(uint)stair_idx];
    local_7c = '\0';
  }
  if (flow_head != flow_tail) {
    iVar18 = (int)avoidance;
    iVar6 = borg.trait[0x1b];
    local_88 = 0;
    do {
      bVar1 = borg_flow_x[flow_tail];
      bVar2 = borg_flow_y[flow_tail];
      flow_tail = flow_tail + L'\x01';
      if (flow_tail == L'؀') {
        flow_tail = L'\0';
      }
      bVar3 = borg_data_cost->data[bVar2][bVar1];
      uVar16 = bVar3 + 1;
      if (local_88 <= bVar3) {
        local_88 = uVar16;
        if (local_7c == '\0') {
          if (depth <= (int)(uint)bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
        }
        else {
          if (depth <= (int)(uint)bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
          if (borg_data_cost->data[iVar11][iVar17] <= bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
        }
      }
      lVar15 = 0;
      do {
        pcVar7 = cave;
        lVar20 = (long)ddx_ddd[lVar15] + (ulong)bVar1;
        lVar22 = (long)ddy_ddd[lVar15] + (ulong)bVar2;
        wVar12 = (wchar_t)lVar22;
        wVar19 = (wchar_t)lVar20;
        lVar10 = (loc)loc(wVar19,wVar12);
        _Var8 = square_in_bounds_fully(pcVar7,lVar10);
        wVar9 = flow_head;
        if ((_Var8) && (uVar16 < borg_data_cost->data[lVar22][lVar20])) {
          pbVar14 = borg_grids[lVar22] + lVar20;
          if ((iVar18 <= iVar6 && sneak) && (borg_desperate & 1U) == 0) {
            lVar21 = 0;
            do {
              pcVar7 = cave;
              sVar4 = ddx_ddd[lVar21];
              sVar5 = ddy_ddd[lVar21];
              lVar10 = (loc)loc((int)((long)wVar19 + (long)sVar4),(int)((long)wVar12 + (long)sVar5))
              ;
              _Var8 = square_in_bounds_fully(pcVar7,lVar10);
              if ((_Var8) &&
                 (wVar9 = flow_head,
                 borg_grids[(long)wVar12 + (long)sVar5][(long)wVar19 + (long)sVar4].kill != '\0'))
              goto LAB_00221468;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 8);
          }
          wVar9 = flow_head;
          if ((((tunneling) || (pbVar14->feat < 0xf || (byte)(pbVar14->feat - 0x17) < 2)) &&
              (bVar3 = pbVar14->feat, bVar3 != 0x16)) &&
             ((bVar3 != 0x17 || (borg.trait[0x40] != 0)))) {
            feat = (wchar_t)bVar3;
            if (avoid) {
              if (feat != L'\0' || iVar6 < iVar18) {
LAB_00221499:
                if (((((pbVar14->kill == '\0') ||
                      ((((borg_desperate == false && (borg.lunal_mode == false)) &&
                        ((borg.munchkin_mode == false && (borg.trait[0x71] == 0)))) &&
                       (((iVar6 < iVar18 || (borg.trait[0x27] < 2)) || (4 < borg.trait[0x24]))))))
                     && ((((borg.goal.shop < 0 || (_Var8 = feat_is_shop(feat), !_Var8)) ||
                          ((ushort)pbVar14->store == borg.goal.shop)) ||
                         ((wVar12 == borg.c.y || (wVar9 = flow_head, wVar19 == borg.c.x)))))) &&
                    (((wVar9 = flow_head, pbVar14->trap != true ||
                      (iVar6 < iVar18 || pbVar14->glyph != false)) ||
                     ((((0x3b < borg.trait[0x1b] &&
                        (((0x1d < borg.trait[0x36] || (0x13 < borg.trait[0x23])) &&
                         ((0x2c < borg.trait[0x36] || (9 < borg.trait[0x23])))))) &&
                       ((0x1d < borg.trait[0x37] || (0x13 < borg.trait[0x23])))) &&
                      ((0x2c < borg.trait[0x37] || (9 < borg.trait[0x23])))))))) &&
                   (borg_data_icky->data[lVar22][lVar20] == '\0')) {
                  if (borg_data_know->data[lVar22][lVar20] == '\0') {
                    borg_data_know->data[lVar22][lVar20] = '\x01';
                    bVar23 = true;
                    if ((((borg_desperate == false) && (borg.lunal_mode == false)) &&
                        (borg.munchkin_mode == false)) && (borg_digging == false)) {
                      wVar9 = borg_danger(wVar12,wVar19,L'\x01',true,false);
                      if (borg.trait[0x24] == 0x32) {
                        wVar12 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
                      }
                      else {
                        wVar12 = (avoidance * 3) / 10;
                      }
                      iVar13 = (int)avoidance;
                      wVar19 = iVar13 * 2;
                      if (scaryguy_on_level == false) {
                        wVar19 = wVar12;
                      }
                      if (((unique_on_level != 0) && (vault_on_level == true)) &&
                         (borg.trait[0x24] == 0x32)) {
                        wVar19 = iVar13 * 3;
                      }
                      if ((scaryguy_on_level != false) && (borg.trait[0x23] < 6)) {
                        wVar19 = iVar13 * 3;
                      }
                      if (borg.goal.ignoring != false) {
                        wVar19 = iVar13 * 5;
                      }
                      wVar12 = iVar13 * 0x19;
                      if (borg_t - borg_began < 0x1389) {
                        wVar12 = wVar19;
                      }
                      wVar19 = iVar13 * 100;
                      if (borg.trait[0x27] != 0) {
                        wVar19 = wVar12;
                      }
                      if (borg.trait[0x23] == 0) {
                        wVar19 = (iVar13 * 3) / 10;
                      }
                      if (wVar19 < wVar9) {
                        borg_data_icky->data[lVar22][lVar20] = '\x01';
                        bVar23 = false;
                      }
                    }
                    wVar9 = flow_head;
                    if (!bVar23) goto LAB_00221468;
                  }
                  borg_data_cost->data[lVar22][lVar20] = (uint8_t)uVar16;
                  borg_flow_x[flow_head] = (uint8_t)lVar20;
                  wVar9 = flow_head + L'\x01';
                  if (wVar9 == L'؀') {
                    wVar9 = L'\0';
                  }
                  bVar23 = wVar9 == flow_tail;
                  borg_flow_y[flow_head] = (uint8_t)lVar22;
                  if (bVar23) {
                    wVar9 = flow_head;
                  }
                }
              }
            }
            else if ((borg_desperate != true || iVar6 < iVar18) || feat != L'\0') goto LAB_00221499;
          }
        }
LAB_00221468:
        flow_head = wVar9;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
    } while (flow_head != flow_tail);
  }
  flow_tail = L'\0';
  flow_head = L'\0';
  return;
}

Assistant:

void borg_flow_spread(int depth, bool optimize, bool avoid, bool tunneling,
    int stair_idx, bool sneak)
{
    int  i;
    int  n, o = 0;
    int  x1, y1;
    int  x, y;
    int  fear = 0;
    int  ii;
    int  yy, xx;
    bool bad_sneak = false;
    int  origin_y, origin_x;
    bool twitchy = false;

    /* Default starting points */
    origin_y = borg.c.y;
    origin_x = borg.c.x;

    /* Is the borg moving under boosted bravery? */
    if (avoidance > borg.trait[BI_CURHP])
        twitchy = true;

    /* Use the closest stair for calculation distance (cost) from the stair to
     * the goal */
    if (stair_idx >= 0 && borg.trait[BI_CLEVEL] < 15) {
        origin_y = track_less.y[stair_idx];
        origin_x = track_less.x[stair_idx];
        optimize = false;
    }

    /* Now process the queue */
    while (flow_head != flow_tail) {
        /* Extract the next entry */
        x1 = borg_flow_x[flow_tail];
        y1 = borg_flow_y[flow_tail];

        /* Circular queue -- dequeue the next entry */
        if (++flow_tail == AUTO_FLOW_MAX)
            flow_tail = 0;

        /* Cost (one per movement grid) */
        n = borg_data_cost->data[y1][x1] + 1;

        /* New depth */
        if (n > o) {
            /* Optimize (if requested) */
            if (optimize && (n > borg_data_cost->data[origin_y][origin_x]))
                break;

            /* Limit depth */
            if (n > depth)
                break;

            /* Save */
            o = n;
        }

        /* Queue the "children" */
        for (i = 0; i < 8; i++) {
            int old_head;

            borg_grid *ag;

            /* reset bad_sneak */
            bad_sneak = false;

            /* Neighbor grid */
            x = x1 + ddx_ddd[i];
            y = y1 + ddy_ddd[i];

            /* only on legal grids */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Skip "reached" grids */
            if (borg_data_cost->data[y][x] <= n)
                continue;

            /* Access the grid */
            ag = &borg_grids[y][x];

            if (sneak && !borg_desperate && !twitchy) {
                /* Scan the neighbors */
                for (ii = 0; ii < 8; ii++) {
                    /* Neighbor grid */
                    xx = x + ddx_ddd[ii];
                    yy = y + ddy_ddd[ii];

                    /* only on legal grids */
                    if (!square_in_bounds_fully(cave, loc(xx, yy)))
                        continue;

                    /* Make sure no monster is on this grid, which is
                     * adjacent to the grid on which, I am thinking about
                     * stepping.
                     */
                    if (borg_grids[yy][xx].kill) {
                        bad_sneak = true;
                        break;
                    }
                }
            }
            /* The grid I am thinking about is adjacent to a monster */
            if (bad_sneak)
                continue;

            /* Avoid "wall" grids (not doors) unless tunneling*/
            /* HACK depends on FEAT order, kinda evil */
            if (!tunneling
                && (ag->feat >= FEAT_SECRET && ag->feat != FEAT_PASS_RUBBLE
                    && ag->feat != FEAT_LAVA))
                continue;

            /* Avoid "perma-wall" grids */
            if (ag->feat == FEAT_PERM)
                continue;

            /* Avoid "Lava" grids (for now) */
            if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
                continue;

            /* Avoid unknown grids (if requested or retreating)
             * unless twitchy.  In which case, explore it
             */
            if ((avoid || borg_desperate) && (ag->feat == FEAT_NONE)
                && !twitchy)
                continue;

            /* flowing into monsters */
            if ((ag->kill)) {
                /* Avoid if Desperate, lunal */
                if (borg_desperate || borg.lunal_mode || borg.munchkin_mode)
                    continue;

                /* Avoid if afraid */
                if (borg.trait[BI_ISAFRAID])
                    continue;

                /* Avoid if low level, unless twitchy */
                if (!twitchy && borg.trait[BI_FOOD] >= 2
                    && borg.trait[BI_MAXCLEVEL] < 5)
                    continue;
            }

            /* Avoid shop entry points if I am not heading to that shop */
            if (borg.goal.shop >= 0 && feat_is_shop(ag->feat)
                && (ag->store != borg.goal.shop) && y != borg.c.y
                && x != borg.c.x)
                continue;

            /* Avoid Traps if low level-- unless brave */
            if (ag->trap && !ag->glyph && !twitchy) {
                /* Do not disarm when you could end up dead */
                if (borg.trait[BI_CURHP] < 60)
                    continue;

                /* Do not disarm when clumsy */
                /* since traps can be physical or magical, gotta check both */
                if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;
                if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;

                /* NOTE:  Traps are tough to deal with as a low
                 * level character.  If any modifications are made above,
                 * then the same changes must be made to borg_flow_direct()
                 * and borg_flow_interesting()
                 */
            }

            /* Ignore "icky" grids */
            if (borg_data_icky->data[y][x])
                continue;

            /* Analyze every grid once */
            if (!borg_data_know->data[y][x]) {
                int p;

                /* Mark as known */
                borg_data_know->data[y][x] = true;

                if (!borg_desperate && !borg.lunal_mode && !borg.munchkin_mode
                    && !borg_digging) {
                    /* Get the danger */
                    p = borg_danger(y, x, 1, true, false);

                    /* Increase bravery */
                    if (borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 5 / 10;
                    if (borg.trait[BI_MAXCLEVEL] != 50)
                        fear = avoidance * 3 / 10;
                    if (scaryguy_on_level)
                        fear = avoidance * 2;
                    if (unique_on_level && vault_on_level
                        && borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 3;
                    if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                        fear = avoidance * 3;
                    if (borg.goal.ignoring)
                        fear = avoidance * 5;
                    if (borg_t - borg_began > 5000)
                        fear = avoidance * 25;
                    if (borg.trait[BI_FOOD] == 0)
                        fear = avoidance * 100;

                    /* Normal in town */
                    if (borg.trait[BI_CLEVEL] == 0)
                        fear = avoidance * 3 / 10;

                    /* Dangerous grid */
                    if (p > fear) {
                        /* Mark as icky */
                        borg_data_icky->data[y][x] = true;

                        /* Ignore this grid */
                        continue;
                    }
                }
            }

            /* Save the flow cost */
            borg_data_cost->data[y][x] = n;

            /* Enqueue that entry */
            borg_flow_x[flow_head] = x;
            borg_flow_y[flow_head] = y;

            /* Circular queue -- memorize head */
            old_head = flow_head;

            /* Circular queue -- insert with wrap */
            if (++flow_head == AUTO_FLOW_MAX)
                flow_head = 0;

            /* Circular queue -- handle overflow (badly) */
            if (flow_head == flow_tail)
                flow_head = old_head;
        }
    }

    /* Forget the flow info */
    flow_head = flow_tail = 0;
}